

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall
cmMakefile::ExecuteCommand
          (cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *deferId)

{
  long *plVar1;
  pointer puVar2;
  _Alloc_hider _Var3;
  pointer ppcVar4;
  cmake *pcVar5;
  element_type *peVar6;
  bool bVar7;
  byte bVar8;
  size_t sVar9;
  ostream *poVar10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  Command command;
  string error_1;
  cmMakefileCall stack_manager;
  ostringstream e;
  _Any_data local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_200;
  bool local_1e0;
  string local_1d8;
  cmMakefileCall local_1b8;
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  pointer local_180;
  undefined8 local_178;
  undefined8 local_170;
  char *local_168;
  undefined8 local_160;
  ios_base local_130 [264];
  
  puVar2 = (this->FunctionBlockers).c.
           super__Vector_base<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->FunctionBlockers).c.
       super__Vector_base<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start != puVar2) &&
     (bVar7 = cmFunctionBlocker::IsFunctionBlocked
                        (puVar2[-1]._M_t.
                         super___uniq_ptr_impl<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmFunctionBlocker_*,_std::default_delete<cmFunctionBlocker>_>
                         .super__Head_base<0UL,_cmFunctionBlocker_*,_false>._M_head_impl,lff,status)
     , bVar7)) {
    return true;
  }
  if ((this->ExecuteCommandCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->ExecuteCommandCallback)._M_invoker)((_Any_data *)&this->ExecuteCommandCallback);
  }
  local_1e0 = false;
  if ((deferId->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    local_200._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_200._M_value + 0x10);
    _Var3._M_p = (deferId->
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 )._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
    plVar1 = (long *)((long)&(deferId->
                             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                             )._M_payload.
                             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                             .
                             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ._M_payload + 0x10);
    if ((long *)_Var3._M_p == plVar1) {
      local_200._16_8_ = *plVar1;
      local_200._24_8_ =
           *(undefined8 *)
            ((long)&(deferId->
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    )._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload + 0x18);
    }
    else {
      local_200._16_8_ = *plVar1;
      local_200._M_value._M_dataplus._M_p = (_Alloc_hider)_Var3._M_p;
    }
    local_200._M_value._M_string_length =
         (deferId->
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         )._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length;
    *(long **)&(deferId->
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
               )._M_payload.
               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
               .
               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ._M_payload = plVar1;
    (deferId->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_payload._M_value._M_string_length = 0;
    *(undefined1 *)
     ((long)&(deferId->
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_payload + 0x10) = 0;
    local_1e0 = true;
  }
  cmMakefileCall::cmMakefileCall
            (&local_1b8,this,lff,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_200,status);
  if ((local_1e0 == true) &&
     (local_1e0 = false,
     local_200._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_200._M_value + 0x10))) {
    operator_delete((void *)local_200._M_value._M_dataplus._M_p,local_200._16_8_ + 1);
  }
  sVar9 = GetRecursionDepthLimit(this);
  if (sVar9 < this->RecursionDepth) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Maximum recursion depth of ",0x1b);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," exceeded",9);
    std::__cxx11::stringbuf::str();
    ppcVar4 = (this->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((this->ExecutionStatusStack).
        super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppcVar4) {
      ppcVar4[-1]->NestedError = true;
    }
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)&local_220,
                        &this->Backtrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_unused._0_8_ != &local_210) {
      operator_delete(local_220._M_unused._M_object,(ulong)(local_210._M_allocated_capacity + 1));
    }
    cmSystemTools::s_FatalErrorOccurred = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    bVar8 = 0;
  }
  else {
    cmState::GetCommandByExactName
              ((Command *)&local_220,
               (this->GlobalGenerator->CMakeInstance->State)._M_t.
               super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
               super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl,
               &((lff->Impl).
                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->LowerCaseName);
    bVar8 = 1;
    if ((code *)local_210._M_allocated_capacity == (code *)0x0) {
      if ((cmSystemTools::s_FatalErrorOccurred == false) &&
         (bVar7 = cmSystemTools::GetInterruptFlag(), !bVar7)) {
        peVar6 = (lff->Impl).
                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        local_1a0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x17;
        local_1a0._8_8_ = "Unknown CMake command \"";
        local_190._M_allocated_capacity = 0;
        local_180 = (peVar6->OriginalName)._M_dataplus._M_p;
        local_190._8_8_ = (peVar6->OriginalName)._M_string_length;
        local_178 = 0;
        local_170 = 2;
        local_168 = "\".";
        local_160 = 0;
        views._M_len = 3;
        views._M_array = (iterator)local_1a0;
        cmCatViews(&local_1d8,views);
        ppcVar4 = (this->ExecutionStatusStack).
                  super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if ((this->ExecutionStatusStack).
            super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
            super__Vector_impl_data._M_start != ppcVar4) {
          ppcVar4[-1]->NestedError = true;
        }
        cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,&local_1d8,
                            &this->Backtrace);
        cmSystemTools::s_FatalErrorOccurred = true;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_) !=
            &local_1d8.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_1d8._M_dataplus._M_p._1_7_,local_1d8._M_dataplus._M_p._0_1_
                                  ),local_1d8.field_2._M_allocated_capacity + 1);
        }
        bVar8 = 0;
      }
    }
    else if ((cmSystemTools::s_FatalErrorOccurred == false) &&
            (bVar7 = cmSystemTools::GetInterruptFlag(), !bVar7)) {
      if (this->GlobalGenerator->CMakeInstance->Trace == true) {
        PrintCommandTrace(this,lff,&this->Backtrace,No);
      }
      if ((code *)local_210._M_allocated_capacity == (code *)0x0) {
        std::__throw_bad_function_call();
      }
      bVar8 = (*(code *)local_210._8_8_)
                        (&local_220,
                         &((lff->Impl).
                           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->Arguments,status);
      bVar8 = bVar8 ^ 1 | status->NestedError;
      if (bVar8 == 1) {
        if (status->NestedError == false) {
          local_1d8._M_dataplus._M_p._0_1_ = 0x20;
          cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                    ((string *)local_1a0,
                     &((lff->Impl).
                       super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->OriginalName,(char *)&local_1d8,&status->Error);
          IssueMessage(this,FATAL_ERROR,(string *)local_1a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._0_8_ != &local_190) {
            operator_delete((void *)local_1a0._0_8_,local_190._M_allocated_capacity + 1);
          }
        }
        if (this->GlobalGenerator->CMakeInstance->CurrentWorkingMode != NORMAL_MODE) {
          cmSystemTools::s_FatalErrorOccurred = true;
        }
      }
      bVar8 = bVar8 ^ 1;
      pcVar5 = this->GlobalGenerator->CMakeInstance;
      if (((pcVar5->ScriptModeExitCode).super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>._M_engaged == true) &&
         (pcVar5->CurrentWorkingMode == SCRIPT_MODE)) {
        (status->ExitCode).super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int> =
             (_Optional_payload_base<int>)
             ((ulong)(uint)(pcVar5->ScriptModeExitCode).super__Optional_base<int,_true,_true>.
                           _M_payload.super__Optional_payload_base<int>._M_payload._M_value |
             0x100000000);
      }
    }
    if ((code *)local_210._M_allocated_capacity != (code *)0x0) {
      (*(code *)local_210._M_allocated_capacity)(&local_220,&local_220,3);
    }
  }
  cmMakefileCall::~cmMakefileCall(&local_1b8);
  return (bool)bVar8;
}

Assistant:

bool cmMakefile::ExecuteCommand(const cmListFileFunction& lff,
                                cmExecutionStatus& status,
                                cm::optional<std::string> deferId)
{
  bool result = true;

  // quick return if blocked
  if (this->IsFunctionBlocked(lff, status)) {
    // No error.
    return result;
  }

  if (this->ExecuteCommandCallback) {
    this->ExecuteCommandCallback();
  }

  // Place this call on the call stack.
  cmMakefileCall stack_manager(this, lff, std::move(deferId), status);
  static_cast<void>(stack_manager);

  // Check for maximum recursion depth.
  size_t depthLimit = this->GetRecursionDepthLimit();
  if (this->RecursionDepth > depthLimit) {
    std::ostringstream e;
    e << "Maximum recursion depth of " << depthLimit << " exceeded";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  // Lookup the command prototype.
  if (cmState::Command command =
        this->GetState()->GetCommandByExactName(lff.LowerCaseName())) {
    // Decide whether to invoke the command.
    if (!cmSystemTools::GetFatalErrorOccurred()) {
      // if trace is enabled, print out invoke information
      if (this->GetCMakeInstance()->GetTrace()) {
        this->PrintCommandTrace(lff, this->Backtrace);
      }
      // Try invoking the command.
      bool invokeSucceeded = command(lff.Arguments(), status);
      bool hadNestedError = status.GetNestedError();
      if (!invokeSucceeded || hadNestedError) {
        if (!hadNestedError) {
          // The command invocation requested that we report an error.
          std::string const error =
            cmStrCat(lff.OriginalName(), ' ', status.GetError());
          this->IssueMessage(MessageType::FATAL_ERROR, error);
        }
        result = false;
        if (this->GetCMakeInstance()->GetWorkingMode() != cmake::NORMAL_MODE) {
          cmSystemTools::SetFatalErrorOccurred();
        }
      }
      if (this->GetCMakeInstance()->HasScriptModeExitCode() &&
          this->GetCMakeInstance()->GetWorkingMode() == cmake::SCRIPT_MODE) {
        // pass-through the exit code from inner cmake_language(EXIT) ,
        // possibly from include() or similar command...
        status.SetExitCode(this->GetCMakeInstance()->GetScriptModeExitCode());
      }
    }
  } else {
    if (!cmSystemTools::GetFatalErrorOccurred()) {
      std::string error =
        cmStrCat("Unknown CMake command \"", lff.OriginalName(), "\".");
      this->IssueMessage(MessageType::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccurred();
    }
  }

  return result;
}